

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpinternalsourcedata.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPInternalSourceData::ProcessBYEPacket
          (RTPInternalSourceData *this,uint8_t *reason,size_t reasonlen,RTPTime *receivetime)

{
  jrtplib *this_00;
  int iVar1;
  uint8_t *__dest;
  
  this_00 = (jrtplib *)(this->super_RTPSourceData).byereason;
  if (this_00 != (jrtplib *)0x0) {
    RTPDeleteByteArray(this_00,(uint8_t *)(this->super_RTPSourceData).super_RTPMemoryObject.mgr,
                       (RTPMemoryManager *)reasonlen);
    (this->super_RTPSourceData).byereason = (uint8_t *)0x0;
    (this->super_RTPSourceData).byereasonlen = 0;
  }
  (this->super_RTPSourceData).byetime.m_t = receivetime->m_t;
  __dest = (uint8_t *)
           operator_new__(reasonlen,(this->super_RTPSourceData).super_RTPMemoryObject.mgr,5);
  (this->super_RTPSourceData).byereason = __dest;
  if (__dest == (uint8_t *)0x0) {
    iVar1 = -1;
  }
  else {
    memcpy(__dest,reason,reasonlen);
    (this->super_RTPSourceData).byereasonlen = reasonlen;
    (this->super_RTPSourceData).receivedbye = true;
    (this->super_RTPSourceData).stats.lastmsgtime.m_t = receivetime->m_t;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int RTPInternalSourceData::ProcessBYEPacket(const uint8_t *reason,size_t reasonlen,const RTPTime &receivetime)
{
	if (byereason)
	{
		RTPDeleteByteArray(byereason,GetMemoryManager());
		byereason = 0;
		byereasonlen = 0;
	}

	byetime = receivetime;
	byereason = RTPNew(GetMemoryManager(),RTPMEM_TYPE_BUFFER_RTCPBYEREASON) uint8_t[reasonlen];
	if (byereason == 0)
		return ERR_RTP_OUTOFMEM;
	memcpy(byereason,reason,reasonlen);
	byereasonlen = reasonlen;
	receivedbye = true;
	stats.SetLastMessageTime(receivetime);
	return 0;
}